

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O1

void idct_1D_u32(int32_t *in,int instride,int32_t *out,int outstride)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int32_t *piVar4;
  
  lVar2 = 8;
  piVar4 = out;
  do {
    *piVar4 = 0;
    piVar4 = piVar4 + outstride;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  if (*in != 0) {
    iVar1 = *in * 0xb5;
    *out = *out + iVar1;
    out[(uint)outstride] = out[(uint)outstride] + iVar1;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1;
  }
  iVar1 = in[(uint)instride];
  if (iVar1 != 0) {
    *out = *out + iVar1 * 0xfb;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * 0xd4;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * 0x8e;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1 * 0x31;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1 * -0x31;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * -0x8e;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * -0xd4;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1 * -0xfb;
  }
  iVar1 = in[(uint)(instride * 2)];
  if (iVar1 != 0) {
    *out = *out + iVar1 * 0xec;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * 0x61;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * -0x61;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1 * -0xec;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1 * -0xec;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * -0x61;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * 0x61;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1 * 0xec;
  }
  iVar1 = in[(uint)(instride * 3)];
  if (iVar1 != 0) {
    *out = *out + iVar1 * 0xd4;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * -0x31;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * -0xfb;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1 * -0x8e;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1 * 0x8e;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * 0xfb;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * 0x31;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1 * -0xd4;
  }
  iVar1 = in[(uint)(instride * 4)];
  if (iVar1 != 0) {
    iVar3 = iVar1 * 0xb5;
    *out = *out + iVar3;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * -0xb5;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * -0xb5;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar3;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar3;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * -0xb5;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * -0xb5;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar3;
  }
  iVar1 = in[(uint)(instride * 5)];
  if (iVar1 != 0) {
    *out = *out + iVar1 * 0x8e;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * -0xfb;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * 0x31;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1 * 0xd4;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1 * -0xd4;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * -0x31;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * 0xfb;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1 * -0x8e;
  }
  iVar1 = in[(uint)(instride * 6)];
  if (iVar1 != 0) {
    *out = *out + iVar1 * 0x61;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * -0xec;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * 0xec;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1 * -0x61;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1 * -0x61;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * 0xec;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * -0xec;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1 * 0x61;
  }
  iVar1 = in[(uint)(instride * 7)];
  if (iVar1 != 0) {
    *out = *out + iVar1 * 0x31;
    out[(uint)outstride] = out[(uint)outstride] + iVar1 * -0x8e;
    out[(uint)(outstride * 2)] = out[(uint)(outstride * 2)] + iVar1 * 0xd4;
    out[(uint)(outstride * 3)] = out[(uint)(outstride * 3)] + iVar1 * -0xfb;
    out[(uint)(outstride * 4)] = out[(uint)(outstride * 4)] + iVar1 * 0xfb;
    out[(uint)(outstride * 5)] = out[(uint)(outstride * 5)] + iVar1 * -0xd4;
    out[(uint)(outstride * 6)] = out[(uint)(outstride * 6)] + iVar1 * 0x8e;
    out[(uint)(outstride * 7)] = out[(uint)(outstride * 7)] + iVar1 * -0x31;
  }
  return;
}

Assistant:

static inline void idct_1D_u32(int32_t *in, int instride, int32_t *out, int outstride)
{
    for (int x = 0; x < 8; x++)
        out[x*outstride] = 0;

    int32_t c;

    c = in[0*instride];
    if (c) {
        // 181  181  181  181  181  181  181  181
        int32_t c181 = c * 181;
        out[0*outstride] += c181;
        out[1*outstride] += c181;
        out[2*outstride] += c181;
        out[3*outstride] += c181;
        out[4*outstride] += c181;
        out[5*outstride] += c181;
        out[6*outstride] += c181;
        out[7*outstride] += c181;
    }

    c = in[1*instride];
    if (c) {
        // 251  212  142   49  -49 -142 -212 -251
        int32_t c251 = c * 251;
        int32_t c212 = c * 212;
        int32_t c142 = c * 142;
        int32_t c49 = c * 49;
        out[0*outstride] += c251;
        out[1*outstride] += c212;
        out[2*outstride] += c142;
        out[3*outstride] += c49;
        out[4*outstride] -= c49;
        out[5*outstride] -= c142;
        out[6*outstride] -= c212;
        out[7*outstride] -= c251;
    }

    c = in[2*instride];
    if (c) {
        // 236   97  -97 -236 -236  -97   97  236
        int32_t c236 = c*236;
        int32_t c97 = c*97;
        out[0*outstride] += c236;
        out[1*outstride] += c97;
        out[2*outstride] -= c97;
        out[3*outstride] -= c236;
        out[4*outstride] -= c236;
        out[5*outstride] -= c97;
        out[6*outstride] += c97;
        out[7*outstride] += c236;
    }

    c = in[3*instride];
    if (c) {
        // 212  -49 -251 -142  142  251   49 -212
        int32_t c212 = c*212;
        int32_t c49 = c*49;
        int32_t c251 = c*251;
        int32_t c142 = c*142;
        out[0*outstride] += c212;
        out[1*outstride] -= c49;
        out[2*outstride] -= c251;
        out[3*outstride] -= c142;
        out[4*outstride] += c142;
        out[5*outstride] += c251;
        out[6*outstride] += c49;
        out[7*outstride] -= c212;
    }

    c = in[4*instride];
    if (c) {
        // 181 -181 -181  181  181 -181 -181  181
        int32_t c181 = c*181;
        out[0*outstride] += c181;
        out[1*outstride] -= c181;
        out[2*outstride] -= c181;
        out[3*outstride] += c181;
        out[4*outstride] += c181;
        out[5*outstride] -= c181;
        out[6*outstride] -= c181;
        out[7*outstride] += c181;
    }

    c = in[5*instride];
    if (c) {
        // 142 -251   49  212 -212  -49  251 -142
        int32_t c142 = c*142;
        int32_t c251 = c*251;
        int32_t c49 = c*49;
        int32_t c212 = c*212;
        out[0*outstride] += c142;
        out[1*outstride] -= c251;
        out[2*outstride] += c49;
        out[3*outstride] += c212;
        out[4*outstride] -= c212;
        out[5*outstride] -= c49;
        out[6*outstride] += c251;
        out[7*outstride] -= c142;
    }

    c = in[6*instride];
    if (c) {
        //  97 -236  236  -97  -97  236 -236   97
        int32_t c97 = c*97;
        int32_t c236 = c*236;
        out[0*outstride] += c97;
        out[1*outstride] -= c236;
        out[2*outstride] += c236;
        out[3*outstride] -= c97;
        out[4*outstride] -= c97;
        out[5*outstride] += c236;
        out[6*outstride] -= c236;
        out[7*outstride] += c97;
    }

    c = in[7*instride];
    if (c) {
        //  49 -142  212 -251  251 -212  142  -49
        int32_t c49 = c*49;
        int32_t c142 = c*142;
        int32_t c212 = c*212;
        int32_t c251 = c*251;
        out[0*outstride] += c49;
        out[1*outstride] -= c142;
        out[2*outstride] += c212;
        out[3*outstride] -= c251;
        out[4*outstride] += c251;
        out[5*outstride] -= c212;
        out[6*outstride] += c142;
        out[7*outstride] -= c49;
    }
}